

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nmTable.c
# Opt level: O0

uint Nm_HashString(char *pName,int TableSize)

{
  uint local_1c;
  uint local_18;
  uint Key;
  uint i;
  int TableSize_local;
  char *pName_local;
  
  local_1c = 0;
  for (local_18 = 0; pName[local_18] != '\0'; local_18 = local_18 + 1) {
    local_1c = Nm_HashString::s_Primes[(ulong)local_18 % 10] * (int)pName[local_18] *
               (int)pName[local_18] ^ local_1c;
  }
  return local_1c % (uint)TableSize;
}

Assistant:

static unsigned Nm_HashString( char * pName, int TableSize ) 
{
    static int s_Primes[10] = { 
        1291, 1699, 2357, 4177, 5147, 
        5647, 6343, 7103, 7873, 8147
    };
    unsigned i, Key = 0;
    for ( i = 0; pName[i] != '\0'; i++ )
        Key ^= s_Primes[i%10]*pName[i]*pName[i];
    return Key % TableSize;
}